

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

void Am_Invalid_Rectangle_Intersect
               (int left,int top,int width,int height,int my_left,int my_top,int my_width,
               int my_height,int *final_left,int *final_top,int *final_width,int *final_height)

{
  int iVar1;
  int iVar2;
  
  iVar2 = my_left + left;
  if (left < 0) {
    iVar2 = my_left;
  }
  *final_left = iVar2;
  iVar1 = my_left + left + width;
  if (my_width <= left + width) {
    iVar1 = my_left + my_width;
  }
  *final_width = iVar1 - iVar2;
  iVar2 = my_top + top;
  if (top < 0) {
    iVar2 = my_top;
  }
  *final_top = iVar2;
  iVar1 = my_top + top + height;
  if (my_height <= top + height) {
    iVar1 = my_top + my_height;
  }
  *final_height = iVar1 - iVar2;
  return;
}

Assistant:

void
Am_Invalid_Rectangle_Intersect(int left, int top, int width, int height,
                               int my_left, int my_top, int my_width,
                               int my_height, int &final_left, int &final_top,
                               int &final_width, int &final_height)
{
  if (left >= 0)
    final_left = my_left + left;
  else
    final_left = my_left;
  if ((left + width) < my_width)
    final_width = my_left + left + width - final_left;
  else
    final_width = my_left + my_width - final_left;
  if (top >= 0)
    final_top = my_top + top;
  else
    final_top = my_top;
  if ((top + height) < my_height)
    final_height = my_top + top + height - final_top;
  else
    final_height = my_top + my_height - final_top;
}